

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlFreeDoc(xmlDocPtr cur)

{
  xmlDictPtr dict_00;
  xmlDtdPtr cur_00;
  int iVar1;
  xmlDeregisterNodeFunc *pp_Var2;
  xmlDictPtr dict;
  xmlDtdPtr intSubset;
  xmlDtdPtr extSubset;
  xmlDocPtr cur_local;
  
  if (cur != (xmlDocPtr)0x0) {
    dict_00 = cur->dict;
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlDeregisterNodeDefaultValue(), *pp_Var2 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var2 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)cur);
    }
    if (cur->ids != (void *)0x0) {
      xmlFreeIDTable((xmlIDTablePtr)cur->ids);
    }
    cur->ids = (void *)0x0;
    if (cur->refs != (void *)0x0) {
      xmlFreeRefTable((xmlRefTablePtr)cur->refs);
    }
    cur->refs = (void *)0x0;
    intSubset = cur->extSubset;
    cur_00 = cur->intSubset;
    if (cur_00 == intSubset) {
      intSubset = (xmlDtdPtr)0x0;
    }
    if (intSubset != (xmlDtdPtr)0x0) {
      xmlUnlinkNodeInternal((xmlNodePtr)cur->extSubset);
      cur->extSubset = (_xmlDtd *)0x0;
      xmlFreeDtd(intSubset);
    }
    if (cur_00 != (xmlDtdPtr)0x0) {
      xmlUnlinkNodeInternal((xmlNodePtr)cur->intSubset);
      cur->intSubset = (_xmlDtd *)0x0;
      xmlFreeDtd(cur_00);
    }
    if (cur->children != (_xmlNode *)0x0) {
      xmlFreeNodeList(cur->children);
    }
    if (cur->oldNs != (_xmlNs *)0x0) {
      xmlFreeNsList(cur->oldNs);
    }
    if ((cur->version != (xmlChar *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict_00,cur->version), iVar1 == 0)))) {
      (*xmlFree)(cur->version);
    }
    if ((cur->name != (char *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 ||
        (iVar1 = xmlDictOwns(dict_00,(xmlChar *)cur->name), iVar1 == 0)))) {
      (*xmlFree)(cur->name);
    }
    if ((cur->encoding != (xmlChar *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict_00,cur->encoding), iVar1 == 0)))) {
      (*xmlFree)(cur->encoding);
    }
    if ((cur->URL != (xmlChar *)0x0) &&
       ((dict_00 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(dict_00,cur->URL), iVar1 == 0)))) {
      (*xmlFree)(cur->URL);
    }
    (*xmlFree)(cur);
    if (dict_00 != (xmlDictPtr)0x0) {
      xmlDictFree(dict_00);
    }
  }
  return;
}

Assistant:

void
xmlFreeDoc(xmlDocPtr cur) {
    xmlDtdPtr extSubset, intSubset;
    xmlDictPtr dict = NULL;

    if (cur == NULL) {
	return;
    }

    dict = cur->dict;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr)cur);

    /*
     * Do this before freeing the children list to avoid ID lookups
     */
    if (cur->ids != NULL) xmlFreeIDTable((xmlIDTablePtr) cur->ids);
    cur->ids = NULL;
    if (cur->refs != NULL) xmlFreeRefTable((xmlRefTablePtr) cur->refs);
    cur->refs = NULL;
    extSubset = cur->extSubset;
    intSubset = cur->intSubset;
    if (intSubset == extSubset)
	extSubset = NULL;
    if (extSubset != NULL) {
	xmlUnlinkNodeInternal((xmlNodePtr) cur->extSubset);
	cur->extSubset = NULL;
	xmlFreeDtd(extSubset);
    }
    if (intSubset != NULL) {
	xmlUnlinkNodeInternal((xmlNodePtr) cur->intSubset);
	cur->intSubset = NULL;
	xmlFreeDtd(intSubset);
    }

    if (cur->children != NULL) xmlFreeNodeList(cur->children);
    if (cur->oldNs != NULL) xmlFreeNsList(cur->oldNs);

    DICT_FREE(cur->version)
    DICT_FREE(cur->name)
    DICT_FREE(cur->encoding)
    DICT_FREE(cur->URL)
    xmlFree(cur);
    if (dict) xmlDictFree(dict);
}